

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Node<const_void_*,_QCss::StyleSheet>::emplaceValue<QCss::StyleSheet>
          (Node<const_void_*,_QCss::StyleSheet> *this,StyleSheet *args)

{
  long in_FS_OFFSET;
  StyleSheet SStack_b8;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QCss::StyleSheet::StyleSheet(&SStack_b8,args);
  QCss::StyleSheet::operator=(&this->value,&SStack_b8);
  QCss::StyleSheet::~StyleSheet(&SStack_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }